

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIsx32(cmMakefile *this)

{
  bool bVar1;
  cmValue cVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_INTERNAL_PLATFORM_ABI",&local_31);
  cVar2 = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((cVar2.Value != (string *)0x0) &&
     (__x._M_str = ((cVar2.Value)->_M_dataplus)._M_p, __x._M_len = (cVar2.Value)->_M_string_length,
     __y._M_str = "ELF X32", __y._M_len = 7, bVar1 = std::operator==(__x,__y), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIsx32() const
{
  if (cmValue plat_abi = this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (*plat_abi == "ELF X32"_s) {
      return true;
    }
  }
  return false;
}